

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector_senswrapper.c
# Opt level: O2

N_Vector N_VCloneEmpty_SensWrapper(N_Vector w)

{
  int iVar1;
  N_Vector_Ops p_Var2;
  _func_N_Vector_N_Vector *p_Var3;
  _func_void_N_Vector *p_Var4;
  _func_sunrealtype_ptr_N_Vector *p_Var5;
  _func_void_sunrealtype_N_Vector *p_Var6;
  _func_void_N_Vector_N_Vector_N_Vector *p_Var7;
  _func_void_N_Vector_N_Vector *p_Var8;
  _func_void_N_Vector_sunrealtype_N_Vector *p_Var9;
  _func_sunrealtype_N_Vector *p_Var10;
  _func_sunrealtype_N_Vector_N_Vector_N_Vector *p_Var11;
  _func_sunrealtype_N_Vector_N_Vector *p_Var12;
  _func_void_sunrealtype_N_Vector_N_Vector *p_Var13;
  _func_int_N_Vector_N_Vector_N_Vector *p_Var14;
  _func_SUNErrCode_int_sunrealtype_ptr_N_Vector_ptr_N_Vector *p_Var15;
  _func_SUNErrCode_int_N_Vector_N_Vector_ptr_sunrealtype_ptr *p_Var16;
  _func_SUNErrCode_int_sunrealtype_ptr_N_Vector_ptr_N_Vector_ptr *p_Var17;
  _func_SUNErrCode_int_N_Vector_ptr_N_Vector_ptr_sunrealtype_ptr *p_Var18;
  _func_SUNErrCode_int_int_sunrealtype_ptr_N_Vector_ptr_N_Vector_ptr_ptr_N_Vector_ptr_ptr *p_Var19;
  N_Vector __ptr;
  N_Vector_Ops __ptr_00;
  N_Vector p_Var20;
  void *pvVar21;
  long lVar22;
  
  if (w != (N_Vector)0x0) {
    pvVar21 = w->content;
    iVar1 = *(int *)((long)pvVar21 + 8);
    if ((0 < iVar1) && (__ptr = (N_Vector)malloc(0x18), __ptr != (N_Vector)0x0)) {
      __ptr_00 = (N_Vector_Ops)malloc(0x1c0);
      if (__ptr_00 != (N_Vector_Ops)0x0) {
        p_Var2 = w->ops;
        p_Var3 = p_Var2->nvclone;
        __ptr_00->nvgetvectorid = p_Var2->nvgetvectorid;
        __ptr_00->nvclone = p_Var3;
        p_Var4 = p_Var2->nvdestroy;
        __ptr_00->nvcloneempty = p_Var2->nvcloneempty;
        __ptr_00->nvdestroy = p_Var4;
        p_Var5 = p_Var2->nvgetarraypointer;
        __ptr_00->nvspace = p_Var2->nvspace;
        __ptr_00->nvgetarraypointer = p_Var5;
        __ptr_00->nvsetarraypointer = p_Var2->nvsetarraypointer;
        p_Var6 = p_Var2->nvconst;
        __ptr_00->nvlinearsum = p_Var2->nvlinearsum;
        __ptr_00->nvconst = p_Var6;
        p_Var7 = p_Var2->nvdiv;
        __ptr_00->nvprod = p_Var2->nvprod;
        __ptr_00->nvdiv = p_Var7;
        p_Var8 = p_Var2->nvabs;
        __ptr_00->nvscale = p_Var2->nvscale;
        __ptr_00->nvabs = p_Var8;
        p_Var9 = p_Var2->nvaddconst;
        __ptr_00->nvinv = p_Var2->nvinv;
        __ptr_00->nvaddconst = p_Var9;
        p_Var10 = p_Var2->nvmaxnorm;
        __ptr_00->nvdotprod = p_Var2->nvdotprod;
        __ptr_00->nvmaxnorm = p_Var10;
        p_Var11 = p_Var2->nvwrmsnormmask;
        __ptr_00->nvwrmsnorm = p_Var2->nvwrmsnorm;
        __ptr_00->nvwrmsnormmask = p_Var11;
        p_Var12 = p_Var2->nvwl2norm;
        __ptr_00->nvmin = p_Var2->nvmin;
        __ptr_00->nvwl2norm = p_Var12;
        p_Var13 = p_Var2->nvcompare;
        __ptr_00->nvl1norm = p_Var2->nvl1norm;
        __ptr_00->nvcompare = p_Var13;
        p_Var14 = p_Var2->nvconstrmask;
        __ptr_00->nvinvtest = p_Var2->nvinvtest;
        __ptr_00->nvconstrmask = p_Var14;
        p_Var15 = p_Var2->nvlinearcombination;
        __ptr_00->nvminquotient = p_Var2->nvminquotient;
        __ptr_00->nvlinearcombination = p_Var15;
        p_Var16 = p_Var2->nvdotprodmulti;
        __ptr_00->nvscaleaddmulti = p_Var2->nvscaleaddmulti;
        __ptr_00->nvdotprodmulti = p_Var16;
        p_Var17 = p_Var2->nvscalevectorarray;
        __ptr_00->nvlinearsumvectorarray = p_Var2->nvlinearsumvectorarray;
        __ptr_00->nvscalevectorarray = p_Var17;
        p_Var18 = p_Var2->nvwrmsnormvectorarray;
        __ptr_00->nvconstvectorarray = p_Var2->nvconstvectorarray;
        __ptr_00->nvwrmsnormvectorarray = p_Var18;
        p_Var19 = p_Var2->nvscaleaddmultivectorarray;
        __ptr_00->nvwrmsnormmaskvectorarray = p_Var2->nvwrmsnormmaskvectorarray;
        __ptr_00->nvscaleaddmultivectorarray = p_Var19;
        __ptr_00->nvlinearcombinationvectorarray = p_Var2->nvlinearcombinationvectorarray;
        p_Var20 = (N_Vector)malloc(0x10);
        if (p_Var20 == (N_Vector)0x0) {
          free(__ptr_00);
        }
        else {
          *(int *)&p_Var20->ops = iVar1;
          *(undefined4 *)((long)&p_Var20->ops + 4) = 0;
          pvVar21 = malloc((long)*(int *)((long)pvVar21 + 8) << 3);
          p_Var20->content = pvVar21;
          if (pvVar21 != (void *)0x0) {
            iVar1 = *(int *)((long)w->content + 8);
            for (lVar22 = 0; lVar22 < iVar1; lVar22 = lVar22 + 1) {
              *(undefined8 *)((long)pvVar21 + lVar22 * 8) = 0;
            }
            __ptr->content = p_Var20;
            __ptr->ops = __ptr_00;
            return __ptr;
          }
          free(__ptr_00);
          free(__ptr);
          __ptr = p_Var20;
        }
      }
      free(__ptr);
    }
  }
  return (N_Vector)0x0;
}

Assistant:

N_Vector N_VCloneEmpty_SensWrapper(N_Vector w)
{
  int i;
  N_Vector v;
  N_Vector_Ops ops;
  N_VectorContent_SensWrapper content;

  if (w == NULL) { return (NULL); }

  if (NV_NVECS_SW(w) < 1) { return (NULL); }

  /* create vector */
  v = NULL;
  v = (N_Vector)malloc(sizeof *v);
  if (v == NULL) { return (NULL); }

  /* create vector operation structure */
  ops = NULL;
  ops = (N_Vector_Ops)malloc(sizeof *ops);
  if (ops == NULL)
  {
    free(v);
    return (NULL);
  }

  ops->nvgetvectorid     = w->ops->nvgetvectorid;
  ops->nvclone           = w->ops->nvclone;
  ops->nvcloneempty      = w->ops->nvcloneempty;
  ops->nvdestroy         = w->ops->nvdestroy;
  ops->nvspace           = w->ops->nvspace;
  ops->nvgetarraypointer = w->ops->nvgetarraypointer;
  ops->nvsetarraypointer = w->ops->nvsetarraypointer;

  /* standard vector operations */
  ops->nvlinearsum    = w->ops->nvlinearsum;
  ops->nvconst        = w->ops->nvconst;
  ops->nvprod         = w->ops->nvprod;
  ops->nvdiv          = w->ops->nvdiv;
  ops->nvscale        = w->ops->nvscale;
  ops->nvabs          = w->ops->nvabs;
  ops->nvinv          = w->ops->nvinv;
  ops->nvaddconst     = w->ops->nvaddconst;
  ops->nvdotprod      = w->ops->nvdotprod;
  ops->nvmaxnorm      = w->ops->nvmaxnorm;
  ops->nvwrmsnormmask = w->ops->nvwrmsnormmask;
  ops->nvwrmsnorm     = w->ops->nvwrmsnorm;
  ops->nvmin          = w->ops->nvmin;
  ops->nvwl2norm      = w->ops->nvwl2norm;
  ops->nvl1norm       = w->ops->nvl1norm;
  ops->nvcompare      = w->ops->nvcompare;
  ops->nvinvtest      = w->ops->nvinvtest;
  ops->nvconstrmask   = w->ops->nvconstrmask;
  ops->nvminquotient  = w->ops->nvminquotient;

  /* fused vector operations */
  ops->nvlinearcombination = w->ops->nvlinearcombination;
  ops->nvscaleaddmulti     = w->ops->nvscaleaddmulti;
  ops->nvdotprodmulti      = w->ops->nvdotprodmulti;

  /* vector array operations */
  ops->nvlinearsumvectorarray         = w->ops->nvlinearsumvectorarray;
  ops->nvscalevectorarray             = w->ops->nvscalevectorarray;
  ops->nvconstvectorarray             = w->ops->nvconstvectorarray;
  ops->nvwrmsnormvectorarray          = w->ops->nvwrmsnormvectorarray;
  ops->nvwrmsnormmaskvectorarray      = w->ops->nvwrmsnormmaskvectorarray;
  ops->nvscaleaddmultivectorarray     = w->ops->nvscaleaddmultivectorarray;
  ops->nvlinearcombinationvectorarray = w->ops->nvlinearcombinationvectorarray;

  /* Create content */
  content = NULL;
  content = (N_VectorContent_SensWrapper)malloc(sizeof *content);
  if (content == NULL)
  {
    free(ops);
    free(v);
    return (NULL);
  }

  content->nvecs    = NV_NVECS_SW(w);
  content->own_vecs = SUNFALSE;
  content->vecs     = NULL;
  content->vecs     = (N_Vector*)malloc(NV_NVECS_SW(w) * sizeof(N_Vector));
  if (content->vecs == NULL)
  {
    free(ops);
    free(v);
    free(content);
    return (NULL);
  }

  /* initialize vector array to null */
  for (i = 0; i < NV_NVECS_SW(w); i++) { content->vecs[i] = NULL; }

  /* Attach content and ops */
  v->content = content;
  v->ops     = ops;

  return (v);
}